

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeTransferError(Vdbe *p)

{
  int iVar1;
  sqlite3 *db;
  sqlite3_value *v;
  _func_void_void_ptr *in_R8;
  
  db = p->db;
  iVar1 = p->rc;
  if (p->zErrMsg == (char *)0x0) {
    if (db->pErr != (Mem *)0x0) {
      sqlite3VdbeMemSetNull(db->pErr);
    }
  }
  else {
    db->bBenignMalloc = db->bBenignMalloc + '\x01';
    if (sqlite3Hooks_0 != (code *)0x0) {
      (*sqlite3Hooks_0)();
    }
    v = db->pErr;
    if (v == (sqlite3_value *)0x0) {
      v = sqlite3ValueNew(db);
      db->pErr = v;
    }
    sqlite3ValueSetStr(v,(int)p->zErrMsg,(void *)0x1,0xff,in_R8);
    if (sqlite3Hooks_1 != (code *)0x0) {
      (*sqlite3Hooks_1)();
    }
    db->bBenignMalloc = db->bBenignMalloc + 0xff;
  }
  db->errCode = iVar1;
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeTransferError(Vdbe *p){
  sqlite3 *db = p->db;
  int rc = p->rc;
  if( p->zErrMsg ){
    db->bBenignMalloc++;
    sqlite3BeginBenignMalloc();
    if( db->pErr==0 ) db->pErr = sqlite3ValueNew(db);
    sqlite3ValueSetStr(db->pErr, -1, p->zErrMsg, SQLITE_UTF8, SQLITE_TRANSIENT);
    sqlite3EndBenignMalloc();
    db->bBenignMalloc--;
  }else if( db->pErr ){
    sqlite3ValueSetNull(db->pErr);
  }
  db->errCode = rc;
  return rc;
}